

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_var.h
# Opt level: O3

void var_act_bump(solver_t *s,uint var)

{
  uint uVar1;
  vec_act_t *pvVar2;
  sdbl_t *psVar3;
  vec_int_t *pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  pvVar2 = s->activity;
  if (pvVar2 == (vec_act_t *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_sdbl.h"
                  ,0x91,"sdbl_t *vec_sdbl_data(vec_sdbl_t *)");
  }
  psVar3 = pvVar2->data;
  uVar6 = psVar3[var];
  uVar7 = s->var_act_inc;
  uVar5 = uVar7;
  if (uVar6 >= uVar7 && uVar6 != uVar7) {
    uVar5 = uVar6;
  }
  if (uVar6 < uVar7) {
    uVar7 = uVar6;
  }
  uVar8 = ((uVar7 & 0xffffffffffff) >> ((char)(uVar5 >> 0x30) - (char)(uVar7 >> 0x30) & 0x3fU)) +
          (uVar5 & 0xffffffffffff);
  uVar7 = (uVar5 >> 0x30) + (uVar8 >> 0x30);
  uVar6 = 0xffffffffffffffff;
  if (uVar7 < 0x10000) {
    uVar6 = (uVar7 << 0x30) + (uVar8 >> ((byte)(uVar8 >> 0x30) & 0x3f));
  }
  psVar3[var] = uVar6;
  if ((s->opts).var_act_limit < uVar6) {
    uVar1 = pvVar2->size;
    uVar6 = (ulong)(s->opts).var_act_rescale;
    if ((ulong)uVar1 != 0) {
      uVar7 = 0;
      do {
        uVar8 = psVar3[uVar7] >> 0x30;
        uVar5 = psVar3[uVar7] & 0xffffffffffff | uVar8 - uVar6 << 0x30;
        if (uVar8 < uVar6) {
          uVar5 = 0x800000000000;
        }
        psVar3[uVar7] = uVar5;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    uVar5 = s->var_act_inc >> 0x30;
    uVar7 = s->var_act_inc & 0xffffffffffff | uVar5 - uVar6 << 0x30;
    if (uVar5 < uVar6) {
      uVar7 = 0x800000000000;
    }
    s->var_act_inc = uVar7;
  }
  pvVar4 = s->var_order->indices;
  if ((var < pvVar4->size) && (uVar1 = pvVar4->data[var], -1 < (int)uVar1)) {
    heap_percolate_up(s->var_order,uVar1);
    return;
  }
  return;
}

Assistant:

static inline void var_act_bump(solver_t *s, unsigned var)
{
    act_t *activity = vec_act_data(s->activity);

    activity[var] = sdbl_add(activity[var], s->var_act_inc);
    if (activity[var] > s->opts.var_act_limit)
        var_act_rescale(s);
    if (heap_in_heap(s->var_order, var))
        heap_decrease(s->var_order, var);
}